

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdtls_openssl.cpp
# Opt level: O2

int q_dgram_write(BIO *bio,char *src,int bytesToWrite)

{
  QUdpSocket *this;
  int iVar1;
  QLoggingCategory *pQVar2;
  void *pvVar3;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  char *local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((src == (char *)0x0 || bio == (BIO *)0x0) || bytesToWrite < 1) {
    pQVar2 = lcTlsBackend();
    bytesToWrite = 0;
    if (((pQVar2->field_2).bools.enabledWarning._q_value._M_base._M_i & 1U) != 0) {
      local_40 = pQVar2->name;
      local_58.d._0_4_ = 2;
      local_58.d._4_4_ = 0;
      local_58.ptr._0_4_ = 0;
      local_58.ptr._4_4_ = 0;
      local_58.size._0_4_ = 0;
      local_58.size._4_4_ = 0;
      bytesToWrite = 0;
      QMessageLogger::warning((char *)&local_58,"invalid input parameter(s)");
    }
  }
  else {
    q_BIO_clear_flags(bio,0xf);
    pvVar3 = q_BIO_get_ex_data(bio,0);
    if (*(char *)((long)pvVar3 + 0x80) == '\0') {
      this = *(QUdpSocket **)((long)pvVar3 + 0x78);
      local_58.size._0_4_ = 0xaaaaaaaa;
      local_58.size._4_4_ = 0xaaaaaaaa;
      local_58.d._0_4_ = 0xaaaaaaaa;
      local_58.d._4_4_ = 0xaaaaaaaa;
      local_58.ptr._0_4_ = 0xaaaaaaaa;
      local_58.ptr._4_4_ = 0xaaaaaaaa;
      QByteArray::fromRawData((QByteArray *)&local_58,src,(ulong)(uint)bytesToWrite);
      iVar1 = QAbstractSocket::state();
      if (iVar1 == 3) {
        lVar4 = QIODevice::write((QByteArray *)this);
      }
      else {
        lVar4 = QUdpSocket::writeDatagram
                          (this,(QByteArray *)&local_58,(QHostAddress *)((long)pvVar3 + 0x48),
                           *(quint16 *)((long)pvVar3 + 0x50));
      }
      bytesToWrite = (int)lVar4;
      if (lVar4 < 1) {
        q_BIO_set_flags(bio,10);
      }
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bytesToWrite;
  }
  __stack_chk_fail();
}

Assistant:

int q_dgram_write(BIO *bio, const char *src, int bytesToWrite)
{
    if (!bio || !src || bytesToWrite <= 0) {
        qCWarning(lcTlsBackend, "invalid input parameter(s)");
        return 0;
    }

    q_BIO_clear_retry_flags(bio);

    auto dtls = static_cast<dtlsopenssl::DtlsState *>(q_BIO_get_app_data(bio));
    Q_ASSERT(dtls);
    if (dtls->writeSuppressed) {
        // See the comment in QDtls::startHandshake.
        return bytesToWrite;
    }

    QUdpSocket *udpSocket = dtls->udpSocket;
    Q_ASSERT(udpSocket);

    const QByteArray dgram(QByteArray::fromRawData(src, bytesToWrite));
    qint64 bytesWritten = -1;
    if (udpSocket->state() == QAbstractSocket::ConnectedState) {
        bytesWritten = udpSocket->write(dgram);
    } else {
        bytesWritten = udpSocket->writeDatagram(dgram, dtls->remoteAddress,
                                                dtls->remotePort);
    }

    if (bytesWritten <= 0)
        q_BIO_set_retry_write(bio);

    Q_ASSERT(bytesWritten <= std::numeric_limits<int>::max());
    return int(bytesWritten);
}